

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectList.cpp
# Opt level: O2

bool __thiscall
ObjectList::Intersect(ObjectList *this,Ray *ray,float t_min,float t_max,hit_record_t *hit_record)

{
  int iVar1;
  int i;
  long lVar2;
  bool bVar3;
  hit_record_t temp_hit;
  float local_68;
  float local_60;
  undefined4 uStack_5c;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  Material *pMStack_38;
  
  bVar3 = false;
  local_68 = t_max;
  for (lVar2 = 0; lVar2 < this->m_size; lVar2 = lVar2 + 1) {
    iVar1 = (*this->m_list[lVar2]->_vptr_Object[2])
                      (t_min,local_68,this->m_list[lVar2],ray,&local_60);
    if ((char)iVar1 != '\0') {
      local_68 = local_60;
      *(undefined8 *)((hit_record->m_normal).e + 2) = local_40;
      hit_record->m_material = pMStack_38;
      *(undefined8 *)((hit_record->m_point).e + 1) = local_50;
      *(undefined8 *)(hit_record->m_normal).e = uStack_48;
      hit_record->m_t = local_60;
      hit_record->m_u = (float)uStack_5c;
      hit_record->m_v = (float)(undefined4)uStack_58;
      (hit_record->m_point).e[0] = (float)uStack_58._4_4_;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool
ObjectList::Intersect(const Ray& ray, float t_min, float t_max, hit_record_t& hit_record) const {

    hit_record_t temp_hit;
    bool         hit       = false;
    float        t_closest = t_max;

    for (int i = 0; i < m_size; i++) {
        if (m_list[i]->Intersect(ray, t_min, t_closest, temp_hit)) {
            hit        = true;
            t_closest  = temp_hit.m_t;
            hit_record = temp_hit;
        }
    }
    return hit;
}